

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

CheckerInstantiationSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::CheckerInstantiationSyntax,slang::syntax::CheckerInstantiationSyntax_const&>
          (BumpAllocator *this,CheckerInstantiationSyntax *args)

{
  CheckerInstantiationSyntax *this_00;
  
  this_00 = (CheckerInstantiationSyntax *)allocate(this,0xa8,8);
  slang::syntax::CheckerInstantiationSyntax::CheckerInstantiationSyntax(this_00,args);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }